

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O1

void __thiscall Corrade::Utility::Configuration::~Configuration(Configuration *this)

{
  pointer pcVar1;
  
  if ((((this->_flags)._value & 0x80000) != 0) && ((this->_filename)._M_string_length != 0)) {
    save(this,&this->_filename);
  }
  pcVar1 = (this->_filename)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_filename).field_2) {
    operator_delete(pcVar1);
  }
  ConfigurationGroup::~ConfigurationGroup(&this->super_ConfigurationGroup);
  return;
}

Assistant:

Configuration::~Configuration() { if(_flags & InternalFlag::Changed) save(); }